

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::usub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  APInt AVar2;
  APInt AStack_38;
  
  APInt(&AStack_38,RHS);
  operator-((llvm *)this,&AStack_38,(APInt *)Overflow);
  ~APInt(&AStack_38);
  bVar1 = ugt(this,RHS);
  *(bool *)in_RCX = bVar1;
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::usub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this-RHS;
  Overflow = Res.ugt(*this);
  return Res;
}